

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void crnd::crnd_trace(char *pFmt,__va_list_tag *args)

{
  bool bVar1;
  char local_218 [8];
  char buf [512];
  __va_list_tag *args_local;
  char *pFmt_local;
  
  buf._504_8_ = args;
  bVar1 = crnd_is_debugger_present();
  if (bVar1) {
    vsprintf(local_218,pFmt,(__gnuc_va_list)buf._504_8_);
    crnd_output_debug_string(local_218);
  }
  return;
}

Assistant:

void crnd_trace(const char* pFmt, va_list args)
    {
        if (crnd_is_debugger_present())
        {
            char buf[512];
#if defined(WIN32) && defined(_MSC_VER)
            vsprintf_s(buf, sizeof(buf), pFmt, args);
#else
    vsprintf(buf, pFmt, args);
#endif

            crnd_output_debug_string(buf);
        }
    }